

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::Members::Members(Members *this,QPDF *pdf)

{
  _Rb_tree_header *p_Var1;
  QPDFObjGen QVar2;
  QPDFObjGen QVar3;
  QPDFObjectHandle QStack_38;
  QPDFObjectHandle local_28;
  
  this->pdf = pdf;
  QPDF::getRoot((QPDF *)&local_28);
  QVar2 = QPDFObjectHandle::getObjGen(&local_28);
  if (QVar2.obj == 0) {
    QVar3.obj = -1;
    QVar3.gen = 0;
  }
  else {
    QPDF::getRoot((QPDF *)&QStack_38);
    QVar3 = QPDFObjectHandle::getObjGen(&QStack_38);
  }
  this->root_og = QVar3;
  if ((QVar2.obj != 0) &&
     (QStack_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (QStack_38.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  this->filename = "unspecified";
  this->file = (FILE *)0x0;
  this->close_file = false;
  this->buffer_pipeline = (Pl_Buffer *)0x0;
  this->output_buffer = (Buffer *)0x0;
  this->normalize_content_set = false;
  this->normalize_content = false;
  this->compress_streams = true;
  this->compress_streams_set = false;
  this->stream_decode_level = qpdf_dl_generalized;
  this->stream_decode_level_set = false;
  this->recompress_flate = false;
  this->qdf_mode = false;
  this->preserve_unreferenced_objects = false;
  this->preserve_unreferenced_objects = false;
  this->newline_before_endstream = false;
  this->static_id = false;
  this->suppress_original_object_ids = false;
  this->direct_stream_lengths = true;
  this->encrypted = false;
  this->preserve_encryption = true;
  this->linearized = false;
  this->pclm = false;
  this->object_stream_mode = qpdf_o_preserve;
  (this->encryption_key)._M_dataplus._M_p = (pointer)&(this->encryption_key).field_2;
  (this->encryption_key)._M_string_length = 0;
  (this->encryption_key).field_2._M_local_buf[0] = '\0';
  this->encrypt_metadata = true;
  this->encrypt_use_aes = false;
  p_Var1 = &(this->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header;
  (this->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->encryption_V = 0;
  this->encryption_R = 0;
  (this->id1)._M_dataplus._M_p = (pointer)&(this->id1).field_2;
  (this->id1)._M_string_length = 0;
  (this->id1).field_2._M_local_buf[0] = '\0';
  (this->id2)._M_dataplus._M_p = (pointer)&(this->id2).field_2;
  (this->id2)._M_string_length = 0;
  (this->id2).field_2._M_local_buf[0] = '\0';
  (this->final_pdf_version)._M_dataplus._M_p = (pointer)&(this->final_pdf_version).field_2;
  (this->final_pdf_version)._M_string_length = 0;
  (this->final_pdf_version).field_2._M_local_buf[0] = '\0';
  this->final_extension_level = 0;
  (this->min_pdf_version)._M_dataplus._M_p = (pointer)&(this->min_pdf_version).field_2;
  (this->min_pdf_version)._M_string_length = 0;
  (this->min_pdf_version).field_2._M_local_buf[0] = '\0';
  this->min_extension_level = 0;
  (this->forced_pdf_version)._M_dataplus._M_p = (pointer)&(this->forced_pdf_version).field_2;
  (this->forced_pdf_version)._M_string_length = 0;
  (this->forced_pdf_version).field_2._M_local_buf[0] = '\0';
  this->forced_extension_level = 0;
  (this->extra_header_text)._M_dataplus._M_p = (pointer)&(this->extra_header_text).field_2;
  (this->extra_header_text)._M_string_length = 0;
  (this->extra_header_text).field_2._M_local_buf[0] = '\0';
  this->encryption_dict_objid = 0;
  (this->cur_data_key)._M_dataplus._M_p = (pointer)&(this->cur_data_key).field_2;
  (this->cur_data_key)._M_string_length = 0;
  (this->cur_data_key).field_2._M_local_buf[0] = '\0';
  (this->to_delete).
  super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->to_delete;
  (this->to_delete).
  super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->to_delete;
  p_Var1 = &(this->obj).super_ObjTable<QPDFWriter::Object>.sparse_elements._M_t._M_impl.
            super__Rb_tree_header;
  (this->obj).super_ObjTable<QPDFWriter::Object>.sparse_elements._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->obj).super_ObjTable<QPDFWriter::Object>.sparse_elements._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  (this->to_delete).
  super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl.
  _M_node._M_size = 0;
  this->pipeline = (Count *)0x0;
  (this->object_queue).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->object_queue).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->object_queue).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->object_queue_front = 0;
  (this->obj).super_ObjTable<QPDFWriter::Object>.
  super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
  super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obj).super_ObjTable<QPDFWriter::Object>.
  super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
  super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obj).super_ObjTable<QPDFWriter::Object>.
  super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
  super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->obj).super_ObjTable<QPDFWriter::Object>.sparse_elements._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->obj).super_ObjTable<QPDFWriter::Object>.sparse_elements._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->obj).super_ObjTable<QPDFWriter::Object>.sparse_elements._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->obj).super_ObjTable<QPDFWriter::Object>.min_sparse = 0xffffffffffffffff;
  (this->obj).streams_empty = false;
  (this->new_obj).super_ObjTable<QPDFWriter::NewObject>.
  super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
  super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_obj).super_ObjTable<QPDFWriter::NewObject>.
  super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
  super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_obj).super_ObjTable<QPDFWriter::NewObject>.
  super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
  super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->new_obj).super_ObjTable<QPDFWriter::NewObject>.sparse_elements._M_t._M_impl.
            super__Rb_tree_header;
  (this->new_obj).super_ObjTable<QPDFWriter::NewObject>.sparse_elements._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->new_obj).super_ObjTable<QPDFWriter::NewObject>.sparse_elements._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->new_obj).super_ObjTable<QPDFWriter::NewObject>.sparse_elements._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->new_obj).super_ObjTable<QPDFWriter::NewObject>.sparse_elements._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->new_obj).super_ObjTable<QPDFWriter::NewObject>.sparse_elements._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (this->new_obj).super_ObjTable<QPDFWriter::NewObject>.min_sparse = 0xffffffffffffffff;
  this->next_objid = 1;
  this->cur_stream_length_id = 0;
  this->cur_stream_length = 0;
  this->added_newline = false;
  this->max_ostream_index = 0;
  p_Var1 = &(this->normalized_streams)._M_t._M_impl.super__Rb_tree_header;
  (this->normalized_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->normalized_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->normalized_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->normalized_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->normalized_streams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header;
  (this->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header;
  (this->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header;
  (this->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->pipeline_stack).super__Vector_base<Pipeline_*,_std::allocator<Pipeline_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->next_stack_id = 2;
  (this->count_buffer)._M_dataplus._M_p = (pointer)&(this->count_buffer).field_2;
  (this->count_buffer)._M_string_length = 0;
  (this->count_buffer).field_2._M_local_buf[0] = '\0';
  this->deterministic_id = false;
  this->md5_pipeline = (Pl_MD5 *)0x0;
  (this->deterministic_id_data)._M_dataplus._M_p = (pointer)&(this->deterministic_id_data).field_2;
  (this->deterministic_id_data)._M_string_length = 0;
  (this->deterministic_id_data).field_2._M_local_buf[0] = '\0';
  this->did_write_setup = false;
  (this->lin_pass1_filename)._M_dataplus._M_p = (pointer)&(this->lin_pass1_filename).field_2;
  (this->lin_pass1_filename)._M_string_length = 0;
  (this->lin_pass1_filename).field_2._M_local_buf[0] = '\0';
  (this->progress_reporter).
  super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->progress_reporter).
  super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->progress_reporter).
           super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = 0;
  this->events_seen = 0;
  this->next_progress_report = 0;
  return;
}

Assistant:

QPDFWriter::Members::Members(QPDF& pdf) :
    pdf(pdf),
    root_og(pdf.getRoot().getObjGen().isIndirect() ? pdf.getRoot().getObjGen() : QPDFObjGen(-1, 0))
{
}